

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O1

void CATCH2_INTERNAL_TEST_51(void)

{
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_68;
  AssertionHandler local_58;
  
  local_68.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_68.line = 0x163;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 6;
  capturedExpression.m_start = "result";
  Catch::AssertionHandler::AssertionHandler(&local_58,macroName,&local_68,capturedExpression,Normal)
  ;
  local_68.file = (char *)CONCAT71(local_68.file._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_58,(ExprLhs<bool> *)&local_68);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }